

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<const_kj::Directory,_std::nullptr_t> __thiscall
kj::Directory::openSubdir(Directory *this,PathPtr path,WriteMode mode)

{
  bool bVar1;
  Own<const_kj::Directory,_std::nullptr_t> *pOVar2;
  Clock *clock;
  InMemoryFileFactory *fileFactory;
  undefined4 in_register_0000000c;
  Directory *extraout_RDX;
  Directory *extraout_RDX_00;
  Directory *pDVar3;
  WriteMode in_R8D;
  Own<const_kj::Directory,_std::nullptr_t> OVar4;
  Own<kj::Directory,_std::nullptr_t> local_b8;
  Fault local_a8;
  Fault f_4;
  Fault f_3;
  Fault f_2;
  Fault f_1;
  Own<const_kj::Directory,_std::nullptr_t> *f;
  Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> local_50;
  undefined1 local_40 [8];
  OwnOwn<const_kj::Directory,_std::nullptr_t> _f611;
  WriteMode mode_local;
  Directory *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)CONCAT44(in_register_0000000c,mode);
  this_local = (Directory *)path.parts.size_;
  _f611.value.ptr._4_4_ = in_R8D;
  path_local.parts.size_ = (size_t)this;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x88))
            (&local_50,path.parts.ptr,this_local,CONCAT44(in_register_0000000c,mode),in_R8D);
  _::readMaybe<kj::Directory_const,decltype(nullptr)>((_ *)local_40,&local_50);
  Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>::~Maybe(&local_50);
  pOVar2 = _::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_40);
  if (pOVar2 == (Own<const_kj::Directory,_std::nullptr_t> *)0x0) {
    bVar1 = has<kj::WriteMode,void>(_f611.value.ptr._4_4_,CREATE);
    if ((!bVar1) || (bVar1 = has<kj::WriteMode,void>(_f611.value.ptr._4_4_,MODIFY), bVar1)) {
      bVar1 = has<kj::WriteMode,void>(_f611.value.ptr._4_4_,MODIFY);
      if ((!bVar1) || (bVar1 = has<kj::WriteMode,void>(_f611.value.ptr._4_4_,CREATE), bVar1)) {
        bVar1 = has<kj::WriteMode,void>(_f611.value.ptr._4_4_,MODIFY);
        if ((bVar1) || (bVar1 = has<kj::WriteMode,void>(_f611.value.ptr._4_4_,CREATE), bVar1)) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55],kj::PathPtr&>
                    (&local_a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x26d,FAILED,(char *)0x0,
                     "\"tryOpenSubdir() returned null despite no preconditions\", path",
                     (char (*) [55])"tryOpenSubdir() returned null despite no preconditions",
                     (PathPtr *)&this_local);
          _::Debug::Fault::~Fault(&local_a8);
        }
        else {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58],kj::PathPtr&>
                    (&f_4,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x26a,FAILED,(char *)0x0,
                     "\"neither WriteMode::CREATE nor WriteMode::MODIFY was given\", path",
                     (char (*) [58])"neither WriteMode::CREATE nor WriteMode::MODIFY was given",
                     (PathPtr *)&this_local);
          _::Debug::Fault::~Fault(&f_4);
        }
      }
      else {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25],kj::PathPtr&>
                  (&f_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x268,FAILED,(char *)0x0,"\"directory does not exist\", path",
                   (char (*) [25])"directory does not exist",(PathPtr *)&this_local);
        _::Debug::Fault::~Fault(&f_3);
      }
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25],kj::PathPtr&>
                (&f_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x266,FAILED,(char *)0x0,"\"directory already exists\", path",
                 (char (*) [25])"directory already exists",(PathPtr *)&this_local);
      _::Debug::Fault::~Fault(&f_2);
    }
    bVar1 = false;
  }
  else {
    pOVar2 = _::OwnOwn<const_kj::Directory,_std::nullptr_t>::operator*
                       ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)local_40);
    pOVar2 = mv<kj::Own<kj::Directory_const,decltype(nullptr)>>(pOVar2);
    Own<const_kj::Directory,_std::nullptr_t>::Own
              ((Own<const_kj::Directory,_std::nullptr_t> *)this,pOVar2);
    bVar1 = true;
  }
  _::OwnOwn<const_kj::Directory,_std::nullptr_t>::~OwnOwn
            ((OwnOwn<const_kj::Directory,_std::nullptr_t> *)local_40);
  pDVar3 = extraout_RDX;
  if (!bVar1) {
    clock = nullClock();
    fileFactory = defaultInMemoryFileFactory();
    newInMemoryDirectory((kj *)&local_b8,clock,fileFactory);
    Own<const_kj::Directory,_std::nullptr_t>::Own
              ((Own<const_kj::Directory,_std::nullptr_t> *)this,&local_b8);
    Own<kj::Directory,_std::nullptr_t>::~Own(&local_b8);
    pDVar3 = extraout_RDX_00;
  }
  OVar4.ptr = pDVar3;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

Own<const Directory> Directory::openSubdir(PathPtr path, WriteMode mode) const {
  KJ_IF_SOME(f, tryOpenSubdir(path, mode)) {
    return kj::mv(f);
  } else if (has(mode, WriteMode::CREATE) && !has(mode, WriteMode::MODIFY)) {
    KJ_FAIL_REQUIRE("directory already exists", path) { break; }
  } else if (has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_REQUIRE("directory does not exist", path) { break; }
  } else if (!has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_ASSERT("neither WriteMode::CREATE nor WriteMode::MODIFY was given", path) { break; }
  } else {
    // Shouldn't happen.
    KJ_FAIL_ASSERT("tryOpenSubdir() returned null despite no preconditions", path) { break; }